

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O2

void add_generator<trng::yarn3s>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>_>_>_>
                *func_map)

{
  char *pcVar1;
  mapped_type *this;
  parameter_type P;
  yarn3s r;
  allocator local_4a;
  anon_class_1_0_00000001 local_49;
  key_type local_48;
  yarn3s local_28;
  
  P.a[2] = DAT_001cf220;
  P.a._0_8_ = trng::yarn3s::trng0;
  trng::yarn3s::yarn3s(&local_28,P);
  pcVar1 = trng::yarn3s::name();
  std::__cxx11::string::string((string *)&local_48,pcVar1,&local_4a);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>_>_>_>
         ::operator[](func_map,&local_48);
  std::function<void(unsigned_long,unsigned_long)>::operator=
            ((function<void(unsigned_long,unsigned_long)> *)this,&local_49);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void add_generator(
    std::map<std::string, std::function<void(std::size_t, unsigned long)>> &func_map) {
  const R r;
  func_map[r.name()] = [&](std::size_t samples, unsigned long seed) {
    generate<R>(samples, seed);
  };
}